

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,PlanningUnitDecPOMDPDiscrete *pu,
          QFunctionJAOHInterface *q,shared_ptr<const_PartialJointPolicyDiscretePure> *pastJPol,
          BGClusterAlgorithm clusterAlg)

{
  _func_int *p_Var1;
  long lVar2;
  Index IVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined1 (*pauVar5) [16];
  LIndex i;
  size_t sVar6;
  type pPVar7;
  ulong uVar8;
  undefined4 extraout_var_00;
  reference ppTVar9;
  reference pvVar10;
  Index in_stack_fffffffffffffc98;
  Index in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  Index in_stack_fffffffffffffca4;
  Type *in_stack_fffffffffffffca8;
  Index in_stack_fffffffffffffcb0;
  Index in_stack_fffffffffffffcb4;
  reference in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  Index in_stack_fffffffffffffcc4;
  Type_AOHIndex *local_338;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  const_reference in_stack_fffffffffffffcf0;
  BayesianGameBase *in_stack_fffffffffffffcf8;
  shared_ptr<const_PartialJointPolicyDiscretePure> *in_stack_fffffffffffffd18;
  QFunctionJAOHInterface *in_stack_fffffffffffffd20;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffd28;
  BayesianGameForDecPOMDPStage *in_stack_fffffffffffffd30;
  Index in_stack_fffffffffffffd38;
  Index in_stack_fffffffffffffd3c;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffd40;
  QHybrid *local_1c0;
  QFunctionJointBeliefInterface *local_1a8;
  Index jaohI;
  Index aohI_1;
  Type_AOHIndex *t_1;
  Type *t1;
  TypeCluster *tc_1;
  TypeClusterList *tcl;
  uint local_148;
  Index tI_1;
  Index agI_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indAOHs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypeIs;
  Index jtI;
  TypeCluster *tc;
  Type_AOHIndex *t;
  Index aohI;
  Index next_oI;
  Index aI;
  Index tI;
  Index ohI2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> observations;
  vector<unsigned_int,_std::allocator<unsigned_int>_> actions;
  Index ohI;
  Index typeI;
  Index fI;
  Index tcI;
  uint local_40;
  Index agI;
  Index ts;
  BGClusterAlgorithm clusterAlg_local;
  shared_ptr<const_PartialJointPolicyDiscretePure> *pastJPol_local;
  QFunctionJAOHInterface *q_local;
  PlanningUnitDecPOMDPDiscrete *pu_local;
  BayesianGameWithClusterInfo *this_local;
  
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18);
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_00d06ad0;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_00d06b20
  ;
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8ba8b2);
  if (q == (QFunctionJAOHInterface *)0x0) {
    local_1a8 = (QFunctionJointBeliefInterface *)0x0;
  }
  else {
    local_1a8 = (QFunctionJointBeliefInterface *)
                __dynamic_cast(q,&QFunctionJAOHInterface::typeinfo,
                               &QFunctionJointBeliefInterface::typeinfo,0xfffffffffffffffe);
  }
  this->_m_qJB = local_1a8;
  if (q == (QFunctionJAOHInterface *)0x0) {
    local_1c0 = (QHybrid *)0x0;
  }
  else {
    local_1c0 = (QHybrid *)__dynamic_cast(q,&QFunctionJAOHInterface::typeinfo,&QHybrid::typeinfo,0);
  }
  this->_m_qHybrid = local_1c0;
  boost::shared_ptr<const_JointPolicyDiscretePure>::shared_ptr
            ((shared_ptr<const_JointPolicyDiscretePure> *)0x8ba99f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8ba9b9);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            *)0x8ba9d3);
  this->_m_clusterAlgorithm = clusterAlg;
  this->_m_thresholdJB = 0.0;
  this->_m_thresholdPjaoh = 0.0;
  IVar3 = BayesianGameForDecPOMDPStageInterface::GetStage
                    ((BayesianGameForDecPOMDPStageInterface *)this);
  local_40 = 0;
  while( true ) {
    iVar4 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])
                      (&(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff
                      );
    if (CONCAT44(extraout_var,iVar4) <= (ulong)local_40) break;
    pauVar5 = (undefined1 (*) [16])operator_new(0x18);
    *pauVar5 = (undefined1  [16])0x0;
    *(undefined8 *)pauVar5[1] = 0;
    std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::vector
              ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)0x8baa9b);
    std::
    vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
    ::push_back((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                (value_type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete(&this->super_BayesianGameForDecPOMDPStage);
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  ((PlanningUnitMADPDiscrete *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
    Globals::CastLIndexToIndex(i);
    actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    while( true ) {
      sVar6 = BayesianGameBase::GetNrTypes
                        ((BayesianGameBase *)
                         CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                         in_stack_fffffffffffffc9c);
      if (sVar6 <= actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8bab62);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8bab6b);
      if (IVar3 != 0) {
        lVar2 = (-0x368 - ((ulong)IVar3 * 4 + 0xf & 0xfffffffffffffff0)) -
                ((ulong)IVar3 * 4 + 0xf & 0xfffffffffffffff0);
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8babd7;
        BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete
                  (&this->super_BayesianGameForDecPOMDPStage);
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8babfc;
        PlanningUnitMADPDiscrete::GetObservationHistoryArrays
                  (*(PlanningUnitMADPDiscrete **)(&stack0xfffffffffffffcf0 + lVar2 + 0x368),
                   *(Index *)((long)&local_318 + lVar2 + 0x36c),
                   *(Index *)((long)&local_318 + lVar2 + 0x368),
                   *(Index *)((long)&local_320 + lVar2 + 0x36c),
                   *(Index **)((long)&local_328 + lVar2 + 0x368));
        aI = 0;
        for (next_oI = 0; next_oI < IVar3; next_oI = next_oI + 1) {
          *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bac2a;
          pPVar7 = boost::shared_ptr<const_PartialJointPolicyDiscretePure>::operator->(pastJPol);
          p_Var1 = (pPVar7->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                   super_JointPolicy._vptr_JointPolicy[0x13];
          *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bac4f;
          iVar4 = (*p_Var1)(pPVar7,(ulong)local_40,(ulong)aI);
          *(int *)(&stack0xfffffffffffffc98 + (ulong)next_oI * 4 + lVar2 + 0x368) = iVar4;
          *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bac9b;
          BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete
                    (&this->super_BayesianGameForDecPOMDPStage);
          *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bacbf;
          aI = PlanningUnitMADPDiscrete::GetSuccessorOHI
                         (*(PlanningUnitMADPDiscrete **)((long)&local_318 + lVar2 + 0x368),
                          *(Index *)((long)&local_320 + lVar2 + 0x36c),
                          *(Index *)((long)&local_320 + lVar2 + 0x368),
                          *(Index *)((long)&local_328 + lVar2 + 0x36c));
        }
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bad3c;
        std::allocator<unsigned_int>::allocator
                  (*(allocator<unsigned_int> **)(&stack0xfffffffffffffc90 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bad5d;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (&stack0xfffffffffffffcc0 + lVar2 + 0x368),
                   *(size_type *)(&stack0xfffffffffffffcb8 + lVar2 + 0x368),
                   *(value_type_conflict1 **)(&stack0xfffffffffffffcb0 + lVar2 + 0x368),
                   *(allocator_type **)(&stack0xfffffffffffffca8 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bad76;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (&stack0xfffffffffffffcb0 + lVar2 + 0x368),
                   *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (&stack0xfffffffffffffca8 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bad82;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (&stack0xfffffffffffffcb0 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bad8e;
        std::allocator<unsigned_int>::~allocator
                  (*(allocator<unsigned_int> **)(&stack0xfffffffffffffc90 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8badc1;
        std::allocator<unsigned_int>::allocator
                  (*(allocator<unsigned_int> **)(&stack0xfffffffffffffc90 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bade2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (&stack0xfffffffffffffcc0 + lVar2 + 0x368),
                   *(size_type *)(&stack0xfffffffffffffcb8 + lVar2 + 0x368),
                   *(value_type_conflict1 **)(&stack0xfffffffffffffcb0 + lVar2 + 0x368),
                   *(allocator_type **)(&stack0xfffffffffffffca8 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8badf4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (&stack0xfffffffffffffcb0 + lVar2 + 0x368),
                   *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (&stack0xfffffffffffffca8 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bae00;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (&stack0xfffffffffffffcb0 + lVar2 + 0x368));
        *(undefined8 *)(&stack0xfffffffffffffc90 + lVar2 + 0x368) = 0x8bae0c;
        std::allocator<unsigned_int>::~allocator
                  (*(allocator<unsigned_int> **)(&stack0xfffffffffffffc90 + lVar2 + 0x368));
      }
      BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete(&this->super_BayesianGameForDecPOMDPStage)
      ;
      PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd30,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd28);
      operator_new(0x10);
      Type_AOHIndex::Type_AOHIndex
                ((Type_AOHIndex *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c);
      operator_new(0x38);
      TypeCluster::TypeCluster
                ((TypeCluster *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c);
      TypeCluster::AddType
                ((TypeCluster *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 in_stack_fffffffffffffca8);
      std::
      vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
      ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::push_back
                ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (value_type *)in_stack_fffffffffffffca8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    local_40 = local_40 + 1;
  }
  BayesianGameBase::GetNrJointTypes
            ((BayesianGameBase *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8bb000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (size_type)in_stack_fffffffffffffcb8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffca8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8bb04e);
  indTypeIs._0_4_ = 0;
  while( true ) {
    uVar8 = (ulong)(uint)indTypeIs;
    sVar6 = BayesianGameBase::GetNrJointTypes
                      ((BayesianGameBase *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    if (sVar6 <= uVar8) break;
    BayesianGameBase::JointToIndividualTypeIndices
              (in_stack_fffffffffffffcf8,(Index)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
    (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
      super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[3])
              (&(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8bb0f6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (size_type)in_stack_fffffffffffffcb8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8bb11e);
    local_148 = 0;
    while( true ) {
      in_stack_fffffffffffffcf8 = (BayesianGameBase *)(ulong)local_148;
      iVar4 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])
                        (&(this->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameIdenticalPayoff);
      if ((BayesianGameBase *)CONCAT44(extraout_var_00,iVar4) <= in_stack_fffffffffffffcf8) break;
      in_stack_fffffffffffffcf0 =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      local_318 = std::
                  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                  ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                        *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      local_320 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at
                            ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
                             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      local_328 = TypeCluster::begin((TypeCluster *)
                                     CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      ppTVar9 = std::_Rb_tree_const_iterator<Type_*>::operator*
                          ((_Rb_tree_const_iterator<Type_*> *)0x8bb22b);
      if (*ppTVar9 == (Type *)0x0) {
        local_338 = (Type_AOHIndex *)0x0;
      }
      else {
        local_338 = (Type_AOHIndex *)
                    __dynamic_cast(*ppTVar9,&Type::typeinfo,&Type_AOHIndex::typeinfo,0);
      }
      in_stack_fffffffffffffcb4 = Type_AOHIndex::GetAOHIndex(local_338);
      in_stack_fffffffffffffcc4 = in_stack_fffffffffffffcb4;
      in_stack_fffffffffffffcb8 =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      *in_stack_fffffffffffffcb8 = in_stack_fffffffffffffcb4;
      local_148 = local_148 + 1;
    }
    in_stack_fffffffffffffca4 =
         BayesianGameBase::IndividualToJointTypeIndices
                   ((BayesianGameBase *)
                    CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    in_stack_fffffffffffffcb0 = in_stack_fffffffffffffca4;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                         CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    *pvVar10 = in_stack_fffffffffffffca4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    indTypeIs._0_4_ = (uint)indTypeIs + 1;
  }
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(                
        const PlanningUnitDecPOMDPDiscrete* pu,
        const QFunctionJAOHInterface* q,
        const boost::shared_ptr<const PartialJointPolicyDiscretePure> &pastJPol,
        BGClusterAlgorithm clusterAlg
    )
        :
            BayesianGameForDecPOMDPStage(  pu, q, pastJPol ),
            _m_pBG()
            ,_m_qJB(dynamic_cast<const QFunctionJointBeliefInterface *>(q))
            ,_m_qHybrid(dynamic_cast<const QHybrid *>(q))
            ,_m_pBGJPol()
            ,_m_clusterAlgorithm(clusterAlg),
            _m_thresholdJB(0),
            _m_thresholdPjaoh(0)
{
    //extra stuff we need to do for cluster info...


    //Construct the individual type sets
    Index ts = GetStage();
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        _m_typeLists.push_back( new TypeClusterList() );
        Index tcI = 0;
        Index fI = CastLIndexToIndex(GetPUDecPOMDPDiscrete()->GetFirstObservationHistoryIndex(agI, ts));
        for(Index typeI=0; typeI < GetNrTypes(agI); typeI++)
        {
            //the type corresponds to the observation history, offset by the
            //first ohI index for this stage
            Index ohI = typeI + fI;
            
            vector<Index> actions;
            vector<Index> observations;
            if(ts > 0)
            {
                Index obsArr[ts];
                Index acsArr[ts];
                GetPUDecPOMDPDiscrete()->GetObservationHistoryArrays(agI, ohI, ts, obsArr);
                Index ohI2 = 0;
                Index tI = 0;
                while(tI < ts)
                {
                    Index aI = pastJPol->GetActionIndex(agI, ohI2);
                    acsArr[tI] = aI;

                    Index next_oI = obsArr[tI];
                    ohI2 = GetPUDecPOMDPDiscrete()->GetSuccessorOHI(agI, ohI2, next_oI);
                    tI++;
                }
                actions = vector<Index>(acsArr[0], acsArr[ts-1]);
                observations = vector<Index>(obsArr[0], obsArr[ts-1]);
            }


            Index aohI = GetPUDecPOMDPDiscrete()->GetActionObservationHistoryIndex(agI, ts, 
                    actions, observations);
            Type_AOHIndex* t =  new Type_AOHIndex(aohI);
            TypeCluster* tc = new TypeCluster(tcI++);
            tc->AddType(t);
            ///store this type:
            _m_typeLists.at(agI)->push_back( tc );
        }
    }

    //on initialization we called BayesianGameForDecPOMDPStage(  pu, q, pastJPol ),
    //which is the public constructor of BayesianGameForDecPOMDPStage, which already
    //computed all joint types.
    //_m_JBs = vector< JointBeliefInterface* >(GetNrJointTypes());
    _m_jaohReps = vector< Index >( GetNrJointTypes() );

    //loop over joint types and store the joint beliefs.
    for(Index jtI=0; jtI < GetNrJointTypes(); jtI++)
    {
        //compute the jaohI
        const vector<Index>& indTypeIs = JointToIndividualTypeIndices(jtI);
        vector<Index> indAOHs(GetNrAgents());
        for(Index agI=0; agI < GetNrAgents(); agI++)
        {
            Index tI = indTypeIs.at(agI);
            TypeClusterList* tcl = _m_typeLists.at(agI);
            TypeCluster* tc =  tcl->at(tI);
            //we know there is just 1 element in this cluster (we just created
            //it above and only added 1 Type_AOHIndex )
            Type* t1 =  *(tc->begin());
            Type_AOHIndex* t =  dynamic_cast< Type_AOHIndex * >(t1);
            Index aohI = t->GetAOHIndex();
            indAOHs.at(agI) = aohI;
        }
        Index jaohI = IndividualToJointTypeIndices(indAOHs);
        _m_jaohReps.at(jtI) = jaohI;
        //the following returns a copy that should be deleted:
        //JointBeliefInterface* jb = GetPUDecPOMDPDiscrete()->GetJointBeliefInterface(jaohI);
        //_m_JBs.at(jtI) = jb;
    }


}